

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Image_Function_Helper::ProjectionProfile
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ProjectionProfileForm4 projectionProfile,Image *image,bool horizontal)

{
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (*projectionProfile)(image,0,0,image->_width,image->_height,horizontal,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector < uint32_t > ProjectionProfile( FunctionTable::ProjectionProfileForm4 projectionProfile,
                                                const Image & image, bool horizontal )
    {
        std::vector < uint32_t > projection;

        projectionProfile( image, 0, 0, image.width(), image.height(), horizontal, projection );

        return projection;
    }